

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

KeyInfo * keyInfoFromExprList(Parse *pParse,ExprList *pList)

{
  int iVar1;
  sqlite3 *db;
  KeyInfo *__s;
  CollSeq *pCVar2;
  int n;
  long lVar3;
  ExprList_item *pEVar4;
  
  db = pParse->db;
  iVar1 = pList->nExpr;
  n = iVar1 * 9 + 0x20;
  __s = (KeyInfo *)sqlite3DbMallocRaw(db,n);
  if (__s != (KeyInfo *)0x0) {
    memset(__s,0,(long)n);
    __s->aSortOrder = (u8 *)(__s->aColl + iVar1);
    __s->nField = (u16)iVar1;
    __s->enc = db->aDb->pSchema->enc;
    __s->db = db;
    if (0 < iVar1) {
      pEVar4 = pList->a;
      lVar3 = 0;
      do {
        pCVar2 = sqlite3ExprCollSeq(pParse,pEVar4->pExpr);
        if (pCVar2 == (CollSeq *)0x0) {
          pCVar2 = db->pDfltColl;
        }
        __s->aColl[lVar3] = pCVar2;
        __s->aSortOrder[lVar3] = pEVar4->sortOrder;
        lVar3 = lVar3 + 1;
        pEVar4 = pEVar4 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return __s;
}

Assistant:

static KeyInfo *keyInfoFromExprList(Parse *pParse, ExprList *pList){
  sqlite3 *db = pParse->db;
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3DbMallocZero(db, sizeof(*pInfo) + nExpr*(sizeof(CollSeq*)+1) );
  if( pInfo ){
    pInfo->aSortOrder = (u8*)&pInfo->aColl[nExpr];
    pInfo->nField = (u16)nExpr;
    pInfo->enc = ENC(db);
    pInfo->db = db;
    for(i=0, pItem=pList->a; i<nExpr; i++, pItem++){
      CollSeq *pColl;
      pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      if( !pColl ){
        pColl = db->pDfltColl;
      }
      pInfo->aColl[i] = pColl;
      pInfo->aSortOrder[i] = pItem->sortOrder;
    }
  }
  return pInfo;
}